

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# permutation.cpp
# Opt level: O3

bool __thiscall Permutation::IsIdentity(Permutation *this)

{
  int *piVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  piVar1 = (this->permutation_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (uint)((ulong)((long)(this->permutation_).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)piVar1) >> 2);
  if ((int)uVar3 < 1) {
    return true;
  }
  if (*piVar1 != 0) {
    return false;
  }
  uVar4 = (ulong)(uVar3 & 0x7fffffff);
  uVar2 = 1;
  do {
    uVar5 = uVar2;
    if (uVar4 == uVar5) break;
    uVar2 = uVar5 + 1;
  } while (uVar5 == (uint)piVar1[uVar5]);
  return uVar4 <= uVar5;
}

Assistant:

bool Permutation::IsIdentity() const {
    for (int i = 0; i < static_cast<int>(permutation_.size()); ++i) {
        if (permutation_[i] != i) {
            return false;
        }
    }

    return true;
}